

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opensketch.h
# Opt level: O0

void __thiscall OpenSketch<4U>::heap_up(OpenSketch<4U> *this,int i)

{
  bool bVar1;
  mapped_type *__b;
  int in_ESI;
  int parent;
  pair<int,_Data<4U>_> *in_stack_ffffffffffffffd8;
  pair<int,_Data<4U>_> *in_stack_ffffffffffffffe0;
  int local_c;
  
  local_c = in_ESI;
  while( true ) {
    if (local_c < 2) {
      return;
    }
    local_c = (local_c + -1) / 2;
    bVar1 = std::operator<=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (bVar1) break;
    std::swap<int,Data<4u>>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    in_stack_ffffffffffffffe0 =
         (pair<int,_Data<4U>_> *)
         std::
         unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
         ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                       *)in_stack_ffffffffffffffe0,(key_type *)in_stack_ffffffffffffffd8);
    __b = std::
          unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
          ::operator[]((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                        *)in_stack_ffffffffffffffe0,(key_type *)in_stack_ffffffffffffffd8);
    std::swap<int>(&in_stack_ffffffffffffffe0->first,__b);
  }
  return;
}

Assistant:

void heap_up(int i) {
		while (i > 1) {
			int parent = (i - 1) / 2;
			if (heap[parent] <= heap[i]) {
				break;
			}
			swap(heap[i], heap[parent]);
			swap(mp[heap[i].second], mp[heap[parent].second]);
			i = parent;
		}
	}